

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

Expression __thiscall
cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
          (detail *this,initializer_list<cnn::expr::Expression> *xs)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  size_type sVar2;
  iterator pEVar3;
  iterator __position;
  Node *pNVar4;
  pointer pVVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  long lVar7;
  Expression EVar8;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> xis;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> local_30;
  
  this_00 = xs->_M_array->pg;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            (&local_30,xs->_M_len,(allocator_type *)&local_38);
  sVar2 = xs->_M_len;
  if (sVar2 != 0) {
    pEVar3 = xs->_M_array;
    lVar7 = 0;
    pVVar5 = local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      pVVar5->t = *(uint *)((long)&(pEVar3->i).t + lVar7);
      pVVar5 = pVVar5 + 1;
      lVar7 = lVar7 + 0x10;
    } while (sVar2 << 4 != lVar7);
  }
  local_3c.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  pNVar4 = (Node *)operator_new(0x50);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_002a2658;
  std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>::
  vector<__gnu_cxx::__normal_iterator<cnn::VariableIndex_const*,std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>>,void>
            ((vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>> *)&pNVar4->args,
             (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
              )local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
              )local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_3d);
  (pNVar4->dim).nd = 0;
  (pNVar4->dim).bd = 1;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_002a44f0;
  __position._M_current =
       (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar4;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar4;
    pppNVar1 = &(this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_3c);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_3c.t;
  uVar6 = extraout_RDX;
  if (local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start != (VariableIndex *)0x0) {
    operator_delete(local_30.
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar6 = extraout_RDX_00;
  }
  EVar8._8_8_ = uVar6;
  EVar8.pg = (ComputationGraph *)this;
  return EVar8;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }